

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void * __thiscall mocker::ir::Interpreter::fastMalloc(Interpreter *this,size_t sz)

{
  Interpreter *local_30;
  void *res;
  void *res_1;
  size_t sz_local;
  Interpreter *this_local;
  
  if ((this->curSize + sz < 0x8001) && (sz < 0x81)) {
    this_local = (Interpreter *)(this->fastMem + this->curSize);
    this->curSize = sz + this->curSize;
  }
  else {
    res_1 = (void *)sz;
    sz_local = (size_t)this;
    local_30 = (Interpreter *)malloc(sz);
    std::vector<void*,std::allocator<void*>>::emplace_back<void*&>
              ((vector<void*,std::allocator<void*>> *)&this->malloced,&local_30);
    this_local = local_30;
  }
  return this_local;
}

Assistant:

void *Interpreter::fastMalloc(std::size_t sz) {
  if (curSize + sz <= Capacity && sz <= 128) {
    auto res = (void *)(fastMem + curSize);
    curSize += sz;
    return res;
  }

  auto res = std::malloc(sz);
  malloced.emplace_back(res);
  return res;
}